

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O1

void av1_encode_sb(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,RUN_TYPE dry_run)

{
  uint8_t uVar1;
  BLOCK_SIZE plane_bsize;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  MB_MODE_INFO *pMVar8;
  uint blk_row;
  uint blk_col;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  int block;
  long lVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  bool bVar25;
  TX_SIZE local_16c;
  AV1_COMP *local_120;
  MACROBLOCK *local_118;
  optimize_ctx *local_110;
  ENTROPY_CONTEXT (*local_108) [32];
  ENTROPY_CONTEXT (*paEStack_100) [32];
  RUN_TYPE local_f8;
  TRELLIS_OPT_TYPE local_f7;
  optimize_ctx ctx;
  
  pMVar8 = *(x->e_mbd).mi;
  pMVar8->skip_txfm = '\x01';
  if ((x->txfm_search_info).skip_txfm == '\0') {
    local_110 = &ctx;
    local_108 = (ENTROPY_CONTEXT (*) [32])0x0;
    paEStack_100 = (ENTROPY_CONTEXT (*) [32])0x0;
    local_f7 = cpi->optimize_seg_arr[*(ushort *)&pMVar8->field_0xa7 & 7];
    uVar1 = ((cpi->common).seq_params)->monochrome;
    uVar24 = 0;
    local_120 = cpi;
    local_118 = x;
    local_f8 = dry_run;
    while( true ) {
      lVar19 = (long)(x->e_mbd).plane[uVar24].subsampling_x;
      lVar14 = (long)(x->e_mbd).plane[uVar24].subsampling_y;
      if ((uVar24 != 0) && ((x->e_mbd).is_chroma_ref != true)) break;
      plane_bsize = av1_ss_size_lookup[bsize][lVar19][lVar14];
      uVar18 = 0;
      if ((x->e_mbd).lossless[*(ushort *)&(*(x->e_mbd).mi)->field_0xa7 & 7] == 0) {
        bVar2 = ""[plane_bsize];
        if (uVar24 == 0) {
LAB_00a3d4ae:
          bVar13 = bVar2;
        }
        else if (bVar2 < 0x11) {
          bVar13 = 3;
          if ((1 < bVar2 - 0xb) && (bVar2 != 4)) goto LAB_00a3d4ae;
        }
        else if (bVar2 == 0x11) {
          bVar13 = 9;
        }
        else {
          if (bVar2 != 0x12) goto LAB_00a3d4ae;
          bVar13 = 10;
        }
        uVar18 = (ulong)bVar13;
      }
      bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [plane_bsize];
      uVar9 = (uint)bVar2;
      bVar13 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
               [plane_bsize];
      uVar10 = (uint)bVar13;
      bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [txsize_to_bsize[uVar18]];
      bVar4 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
              [txsize_to_bsize[uVar18]];
      uVar12 = (ulong)(uint)((int)uVar18 << 2);
      iVar6 = *(int *)((long)tx_size_high_unit + uVar12);
      iVar7 = *(int *)((long)tx_size_wide_unit + uVar12);
      av1_get_entropy_contexts(plane_bsize,(x->e_mbd).plane + uVar24,ctx.ta[uVar24],ctx.tl[uVar24]);
      av1_subtract_plane(x,plane_bsize,(int)uVar24);
      bVar5 = *(byte *)(lVar14 + lVar19 * 2 + 0xdcf500);
      uVar20 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [bVar5];
      if (bVar2 < "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [bVar5]) {
        uVar20 = uVar9;
      }
      uVar22 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [bVar5];
      if (bVar13 < "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [bVar5]) {
        uVar22 = uVar10;
      }
      block = 0;
      local_108 = ctx.ta + uVar24;
      paEStack_100 = ctx.tl + uVar24;
      uVar11 = 0;
      do {
        uVar21 = uVar22 + uVar11;
        uVar15 = uVar10;
        if (uVar21 < uVar10) {
          uVar15 = uVar21;
        }
        uVar16 = 0;
        do {
          uVar17 = uVar20 + uVar16;
          blk_row = uVar11;
          uVar23 = uVar9;
          if (uVar17 < uVar9) {
            uVar23 = uVar17;
          }
          for (; blk_col = uVar16, blk_row < uVar15; blk_row = blk_row + bVar4) {
            for (; blk_col < uVar23; blk_col = blk_col + bVar3) {
              local_16c = (TX_SIZE)uVar18;
              encode_block_inter((int)uVar24,block,blk_row,blk_col,plane_bsize,local_16c,&local_120,
                                 dry_run);
              block = block + iVar6 * iVar7;
            }
          }
          uVar16 = uVar17;
        } while (uVar17 < uVar9);
        uVar11 = uVar21;
      } while (uVar21 < uVar10);
      if (uVar1 != '\0') {
        return;
      }
      bVar25 = 1 < uVar24;
      uVar24 = uVar24 + 1;
      if (bVar25) {
        return;
      }
    }
  }
  return;
}

Assistant:

void av1_encode_sb(const struct AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize,
                   RUN_TYPE dry_run) {
  assert(bsize < BLOCK_SIZES_ALL);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  // In the current encoder implementation, for inter blocks,
  // only when YUV planes all have zero quantized transform coefficients,
  // mbmi->skip_txfm flag is set to 1.
  // For intra blocks, this flag is set to 0 since skipped blocks are so rare
  // that transmitting skip_txfm = 1 is very expensive.
  // mbmi->skip_txfm is init to 1, and will be modified in encode_block() based
  // on transform, quantization, and (if exists) trellis optimization.
  mbmi->skip_txfm = 1;
  if (x->txfm_search_info.skip_txfm) return;

  struct optimize_ctx ctx;
  struct encode_b_args arg = {
    cpi, x, &ctx, NULL, NULL, dry_run, cpi->optimize_seg_arr[mbmi->segment_id]
  };
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  for (int plane = 0; plane < num_planes; ++plane) {
    const struct macroblockd_plane *const pd = &xd->plane[plane];
    const int subsampling_x = pd->subsampling_x;
    const int subsampling_y = pd->subsampling_y;
    if (plane && !xd->is_chroma_ref) break;
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(bsize, subsampling_x, subsampling_y);
    assert(plane_bsize < BLOCK_SIZES_ALL);
    const int mi_width = mi_size_wide[plane_bsize];
    const int mi_height = mi_size_high[plane_bsize];
    const TX_SIZE max_tx_size = get_vartx_max_txsize(xd, plane_bsize, plane);
    const BLOCK_SIZE txb_size = txsize_to_bsize[max_tx_size];
    const int bw = mi_size_wide[txb_size];
    const int bh = mi_size_high[txb_size];
    int block = 0;
    const int step =
        tx_size_wide_unit[max_tx_size] * tx_size_high_unit[max_tx_size];
    av1_get_entropy_contexts(plane_bsize, pd, ctx.ta[plane], ctx.tl[plane]);
    av1_subtract_plane(x, plane_bsize, plane);
    arg.ta = ctx.ta[plane];
    arg.tl = ctx.tl[plane];
    const BLOCK_SIZE max_unit_bsize =
        get_plane_block_size(BLOCK_64X64, subsampling_x, subsampling_y);
    int mu_blocks_wide = mi_size_wide[max_unit_bsize];
    int mu_blocks_high = mi_size_high[max_unit_bsize];
    mu_blocks_wide = AOMMIN(mi_width, mu_blocks_wide);
    mu_blocks_high = AOMMIN(mi_height, mu_blocks_high);

    for (int idy = 0; idy < mi_height; idy += mu_blocks_high) {
      for (int idx = 0; idx < mi_width; idx += mu_blocks_wide) {
        int blk_row, blk_col;
        const int unit_height = AOMMIN(mu_blocks_high + idy, mi_height);
        const int unit_width = AOMMIN(mu_blocks_wide + idx, mi_width);
        for (blk_row = idy; blk_row < unit_height; blk_row += bh) {
          for (blk_col = idx; blk_col < unit_width; blk_col += bw) {
            encode_block_inter(plane, block, blk_row, blk_col, plane_bsize,
                               max_tx_size, &arg, dry_run);
            block += step;
          }
        }
      }
    }
  }
}